

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar9;
  ulong uVar10;
  code *extraout_RDX;
  secp256k1_fe *a_00;
  ulong uVar11;
  secp256k1_gej *a_01;
  ulong uVar12;
  ulong uVar13;
  secp256k1_scalar *ng;
  secp256k1_gej *a_02;
  ulong uVar14;
  secp256k1_gej *psVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  secp256k1_fe *r_00;
  ulong uVar19;
  secp256k1_gej *a_03;
  secp256k1_fe h3;
  secp256k1_fe s1;
  secp256k1_fe u2;
  secp256k1_fe az;
  secp256k1_fe s2;
  secp256k1_fe u1;
  secp256k1_fe z12;
  secp256k1_strauss_state sStack_dd8;
  secp256k1_scalar sStack_dc0;
  secp256k1_gej sStack_da0;
  secp256k1_gej sStack_d08;
  secp256k1_ge sStack_c70;
  secp256k1_fe asStack_c08 [8];
  secp256k1_ge asStack_a88 [8];
  secp256k1_strauss_point_state sStack_748;
  secp256k1_gej *psStack_330;
  ulong uStack_328;
  ulong uStack_320;
  secp256k1_gej *psStack_318;
  secp256k1_modinv64_signed62 *psStack_310;
  code *pcStack_308;
  long lStack_2f8;
  ulong uStack_2f0;
  secp256k1_modinv64_signed62 sStack_2e8;
  secp256k1_fe sStack_2c0;
  secp256k1_gej *psStack_288;
  secp256k1_gej *psStack_280;
  secp256k1_fe *psStack_278;
  secp256k1_gej *psStack_270;
  secp256k1_gej *psStack_268;
  secp256k1_fe *psStack_260;
  secp256k1_fe *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  ulong local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t local_1a8;
  uint64_t uStack_1a0;
  ulong local_198;
  ulong local_190;
  undefined1 local_188 [56];
  uint64_t uStack_150;
  uint64_t local_148;
  uint64_t uStack_140;
  uint64_t local_138;
  int local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  secp256k1_fe *local_48;
  int local_40;
  int iStack_3c;
  undefined8 uVar8;
  
  psStack_260 = (secp256k1_fe *)0x150e4f;
  secp256k1_gej_verify(a);
  psStack_260 = (secp256k1_fe *)0x150e57;
  secp256k1_ge_verify(b);
  psStack_260 = (secp256k1_fe *)0x150e5f;
  secp256k1_fe_verify(bzinv);
  if (a->infinity != 0) {
    r->infinity = b->infinity;
    psStack_260 = (secp256k1_fe *)0x150e8b;
    secp256k1_fe_sqr(&local_128,bzinv);
    psStack_260 = (secp256k1_fe *)0x150ea1;
    secp256k1_fe_mul(&local_98,&local_128,bzinv);
    psStack_260 = (secp256k1_fe *)0x150eaf;
    secp256k1_fe_mul(&r->x,&b->x,&local_128);
    psStack_260 = (secp256k1_fe *)0x150ec2;
    secp256k1_fe_mul(&r->y,&b->y,&local_98);
    a = (secp256k1_gej *)&r->z;
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).magnitude = 1;
    (r->z).normalized = 1;
LAB_00150eed:
    psStack_260 = (secp256k1_fe *)0x150ef2;
    secp256k1_fe_verify(&a->x);
    psStack_260 = (secp256k1_fe *)0x150efa;
    secp256k1_gej_verify(r);
    return;
  }
  if (b->infinity != 0) {
    memcpy(r,a,0x98);
    return;
  }
  local_250 = &a->z;
  psStack_260 = (secp256k1_fe *)0x150f51;
  secp256k1_fe_mul(&local_128,local_250,bzinv);
  r_00 = &local_98;
  psStack_260 = (secp256k1_fe *)0x150f64;
  secp256k1_fe_sqr(r_00,&local_128);
  local_c8.n[0] = (a->x).n[0];
  local_c8.n[1] = (a->x).n[1];
  local_c8.n[2] = (a->x).n[2];
  local_c8.n[3] = (a->x).n[3];
  local_c8.n[4] = (a->x).n[4];
  local_c8.magnitude = (a->x).magnitude;
  local_c8.normalized = (a->x).normalized;
  a_00 = &local_c8;
  psStack_260 = (secp256k1_fe *)0x150f99;
  secp256k1_fe_mul((secp256k1_fe *)(local_188 + 0x30),&b->x,r_00);
  local_1e8._0_8_ = (a->y).n[0];
  local_1e8._8_8_ = (a->y).n[1];
  local_1e8._16_8_ = (a->y).n[2];
  local_1e8._24_8_ = (a->y).n[3];
  local_1e8._32_8_ = (a->y).n[4];
  local_1e8._40_4_ = (a->y).magnitude;
  local_1e8._44_4_ = (a->y).normalized;
  psStack_260 = (secp256k1_fe *)0x150fd7;
  secp256k1_fe_mul(&local_f8,&b->y,r_00);
  psStack_260 = (secp256k1_fe *)0x150fea;
  secp256k1_fe_mul(&local_f8,&local_f8,&local_128);
  psStack_260 = (secp256k1_fe *)0x150ff2;
  secp256k1_fe_verify(a_00);
  a_01 = (secp256k1_gej *)0x4;
  psStack_260 = (secp256k1_fe *)0x150fff;
  secp256k1_fe_verify_magnitude(a_00,4);
  local_1e8._48_8_ = 0x9ffff5ffffd9d6 - local_c8.n[0];
  uStack_1b0 = 0x9ffffffffffff6 - local_c8.n[1];
  a_03 = (secp256k1_gej *)(local_1e8 + 0x30);
  local_1a8 = 0x9ffffffffffff6 - local_c8.n[2];
  uStack_1a0 = 0x9ffffffffffff6 - local_c8.n[3];
  local_198 = 0x9fffffffffff6 - local_c8.n[4];
  local_190 = 5;
  psStack_260 = (secp256k1_fe *)0x15104e;
  secp256k1_fe_verify((secp256k1_fe *)a_03);
  psStack_260 = (secp256k1_fe *)0x151056;
  secp256k1_fe_verify((secp256k1_fe *)a_03);
  psVar15 = (secp256k1_gej *)(local_188 + 0x30);
  psStack_260 = (secp256k1_fe *)0x151066;
  a_02 = psVar15;
  secp256k1_fe_verify((secp256k1_fe *)psVar15);
  if (local_130 + (int)local_190 < 0x21) {
    local_1e8._48_8_ = local_1e8._48_8_ + local_188._48_8_;
    uStack_1b0 = uStack_1b0 + uStack_150;
    local_1a8 = local_1a8 + local_148;
    uStack_1a0 = uStack_1a0 + uStack_140;
    local_198 = local_198 + local_138;
    r_00 = (secp256k1_fe *)0x3fffffffffffc;
    local_190 = (ulong)(uint)(local_130 + (int)local_190);
    psStack_260 = (secp256k1_fe *)0x1510c9;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    psStack_260 = (secp256k1_fe *)0x1510d9;
    secp256k1_fe_verify(&local_f8);
    a_01 = (secp256k1_gej *)0x1;
    psStack_260 = (secp256k1_fe *)0x1510e6;
    secp256k1_fe_verify_magnitude(&local_f8,1);
    local_248._48_8_ = 0x3ffffbfffff0bc - local_f8.n[0];
    uStack_210 = 0x3ffffffffffffc - local_f8.n[1];
    psVar15 = (secp256k1_gej *)(local_248 + 0x30);
    local_208 = 0x3ffffffffffffc - local_f8.n[2];
    uStack_200 = 0x3ffffffffffffc - local_f8.n[3];
    local_1f8 = 0x3fffffffffffc - local_f8.n[4];
    local_1f0 = 2;
    psStack_260 = (secp256k1_fe *)0x151130;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    psStack_260 = (secp256k1_fe *)0x151138;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    a_03 = (secp256k1_gej *)local_1e8;
    psStack_260 = (secp256k1_fe *)0x151145;
    a_02 = a_03;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x20 < local_1e8._40_4_ + (int)local_1f0) goto LAB_00151611;
    local_248._48_8_ = local_248._48_8_ + local_1e8._0_8_;
    uStack_210 = uStack_210 + local_1e8._8_8_;
    local_208 = local_208 + local_1e8._16_8_;
    uStack_200 = uStack_200 + local_1e8._24_8_;
    local_1f8 = local_1f8 + local_1e8._32_8_;
    local_1f0 = (ulong)(uint)(local_1e8._40_4_ + (int)local_1f0);
    psStack_260 = (secp256k1_fe *)0x1511ac;
    secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
    psStack_260 = (secp256k1_fe *)0x1511bc;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    a_00 = (secp256k1_fe *)0x1000003d1;
    uVar6 = (local_198 >> 0x30) * 0x1000003d1 + local_1e8._48_8_;
    if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
      uVar9 = (uVar6 >> 0x34) + uStack_1b0;
      uVar12 = (uVar9 >> 0x34) + local_1a8;
      uVar14 = (uVar12 >> 0x34) + uStack_1a0;
      uVar16 = (uVar14 >> 0x34) + (local_198 & 0xffffffffffff);
      if ((((uVar9 | uVar6 | uVar12 | uVar14) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
         (((uVar6 | 0x1000003d0) & uVar9 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_260 = (secp256k1_fe *)0x15154e;
        secp256k1_fe_verify((secp256k1_fe *)(local_248 + 0x30));
        uVar6 = (local_1f8 >> 0x30) * 0x1000003d1 + local_248._48_8_;
        if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
          uVar9 = (uVar6 >> 0x34) + uStack_210;
          uVar12 = (uVar9 >> 0x34) + local_208;
          uVar14 = (uVar12 >> 0x34) + uStack_200;
          uVar16 = (uVar14 >> 0x34) + (local_1f8 & 0xffffffffffff);
          if ((((uVar9 | uVar6 | uVar12 | uVar14) & 0xfffffffffffff) == 0 && uVar16 == 0) ||
             (((uVar6 | 0x1000003d0) & uVar9 & uVar12 & uVar14 & (uVar16 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            psStack_260 = (secp256k1_fe *)0x151607;
            secp256k1_gej_double_var(r,a,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_260 = (secp256k1_fe *)0x1515f5;
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    a_03 = (secp256k1_gej *)(local_1e8 + 0x30);
    psStack_260 = (secp256k1_fe *)0x151299;
    secp256k1_fe_mul(&r->z,local_250,(secp256k1_fe *)a_03);
    a = (secp256k1_gej *)&stack0xffffffffffffff98;
    psStack_260 = (secp256k1_fe *)0x1512ac;
    secp256k1_fe_sqr((secp256k1_fe *)a,(secp256k1_fe *)a_03);
    psStack_260 = (secp256k1_fe *)0x1512b4;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_260 = (secp256k1_fe *)0x1512c1;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)a,1);
    local_68 = 0x3ffffbfffff0bc - local_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    local_58 = 0x3ffffffffffffc - local_58;
    uStack_50 = 0x3ffffffffffffc - uStack_50;
    r_00 = (secp256k1_fe *)(0x3fffffffffffc - (long)local_48);
    local_40 = 2;
    iStack_3c = 0;
    psStack_260 = (secp256k1_fe *)0x1512ff;
    local_48 = r_00;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psVar15 = (secp256k1_gej *)local_248;
    psStack_260 = (secp256k1_fe *)0x151312;
    secp256k1_fe_mul((secp256k1_fe *)psVar15,(secp256k1_fe *)a,(secp256k1_fe *)a_03);
    psStack_260 = (secp256k1_fe *)0x15132a;
    secp256k1_fe_mul((secp256k1_fe *)local_188,&local_c8,(secp256k1_fe *)a);
    a_01 = (secp256k1_gej *)(local_248 + 0x30);
    psStack_260 = (secp256k1_fe *)0x151337;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_01);
    psStack_260 = (secp256k1_fe *)0x15133f;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_fe *)0x151347;
    a_02 = psVar15;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    iVar5 = local_248._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_00151616;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._0_8_;
    (r->x).n[1] = uVar2 + local_248._8_8_;
    (r->x).n[2] = uVar3 + local_248._16_8_;
    (r->x).n[3] = uVar4 + local_248._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_248._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_fe *)0x151391;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_fe *)0x151399;
    secp256k1_fe_verify(&r->x);
    a = (secp256k1_gej *)local_188;
    psStack_260 = (secp256k1_fe *)0x1513a9;
    a_02 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar5 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_0015161b;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar2 + local_188._8_8_;
    (r->x).n[2] = uVar3 + local_188._16_8_;
    (r->x).n[3] = uVar4 + local_188._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_188._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_fe *)0x1513f8;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_fe *)0x151400;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_fe *)0x151408;
    a_02 = a;
    secp256k1_fe_verify((secp256k1_fe *)a);
    iVar5 = local_188._40_4_ + (r->x).magnitude;
    if (0x20 < iVar5) goto LAB_00151620;
    uVar2 = (r->x).n[1];
    uVar3 = (r->x).n[2];
    uVar4 = (r->x).n[3];
    a = (secp256k1_gej *)local_188;
    (r->x).n[0] = (r->x).n[0] + local_188._0_8_;
    (r->x).n[1] = uVar2 + local_188._8_8_;
    (r->x).n[2] = uVar3 + local_188._16_8_;
    (r->x).n[3] = uVar4 + local_188._24_8_;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_188._32_8_;
    (r->x).magnitude = iVar5;
    (r->x).normalized = 0;
    psStack_260 = (secp256k1_fe *)0x151457;
    secp256k1_fe_verify(&r->x);
    psStack_260 = (secp256k1_fe *)0x15145f;
    secp256k1_fe_verify((secp256k1_fe *)a);
    psStack_260 = (secp256k1_fe *)0x151467;
    a_02 = r;
    secp256k1_fe_verify(&r->x);
    iVar5 = (r->x).magnitude + local_188._40_4_;
    if (iVar5 < 0x21) {
      local_188._0_8_ = (r->x).n[0] + local_188._0_8_;
      local_188._8_8_ = (r->x).n[1] + local_188._8_8_;
      local_188._16_8_ = (r->x).n[2] + local_188._16_8_;
      local_188._24_8_ = (r->x).n[3] + local_188._24_8_;
      local_188._32_8_ = local_188._32_8_ + (r->x).n[4];
      local_188._44_4_ = 0;
      psStack_260 = (secp256k1_fe *)0x1514ba;
      local_188._40_4_ = iVar5;
      secp256k1_fe_verify((secp256k1_fe *)local_188);
      a = (secp256k1_gej *)&r->y;
      psStack_260 = (secp256k1_fe *)0x1514ce;
      secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)local_188,
                       (secp256k1_fe *)(local_248 + 0x30));
      a_03 = (secp256k1_gej *)local_248;
      psStack_260 = (secp256k1_fe *)0x1514e3;
      a_01 = a_03;
      secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)a_03,(secp256k1_fe *)local_1e8);
      psStack_260 = (secp256k1_fe *)0x1514eb;
      secp256k1_fe_verify((secp256k1_fe *)a);
      psStack_260 = (secp256k1_fe *)0x1514f3;
      a_02 = a_03;
      secp256k1_fe_verify((secp256k1_fe *)a_03);
      iVar5 = local_248._40_4_ + (r->y).magnitude;
      if (iVar5 < 0x21) {
        uVar2 = (r->y).n[1];
        uVar3 = (r->y).n[2];
        uVar4 = (r->y).n[3];
        (r->y).n[0] = (r->y).n[0] + local_248._0_8_;
        (r->y).n[1] = uVar2 + local_248._8_8_;
        (r->y).n[2] = uVar3 + local_248._16_8_;
        (r->y).n[3] = uVar4 + local_248._24_8_;
        puVar1 = (r->y).n + 4;
        *puVar1 = *puVar1 + local_248._32_8_;
        (r->y).magnitude = iVar5;
        (r->y).normalized = 0;
        goto LAB_00150eed;
      }
      goto LAB_0015162a;
    }
  }
  else {
    psStack_260 = (secp256k1_fe *)0x151611;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00151611:
    psStack_260 = (secp256k1_fe *)0x151616;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00151616:
    psStack_260 = (secp256k1_fe *)0x15161b;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_0015161b:
    psStack_260 = (secp256k1_fe *)0x151620;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00151620:
    psStack_260 = (secp256k1_fe *)0x151625;
    secp256k1_gej_add_zinv_var_cold_3();
  }
  psStack_260 = (secp256k1_fe *)0x15162a;
  secp256k1_gej_add_zinv_var_cold_2();
LAB_0015162a:
  psStack_260 = (secp256k1_fe *)secp256k1_fe_inv_var;
  secp256k1_gej_add_zinv_var_cold_1();
  pcStack_308 = (code *)0x15164b;
  psStack_288 = r;
  psStack_280 = psVar15;
  psStack_278 = r_00;
  psStack_270 = a;
  psStack_268 = a_03;
  psStack_260 = a_00;
  secp256k1_fe_verify(&a_01->x);
  uVar6 = (a_01->x).n[4];
  lStack_2f8 = 0x1000003d1;
  uVar9 = (uVar6 >> 0x30) * 0x1000003d1 + (a_01->x).n[0];
  uVar19 = (uVar9 >> 0x34) + (a_01->x).n[1];
  uVar14 = (uVar19 >> 0x34) + (a_01->x).n[2];
  uVar16 = (uVar14 >> 0x34) + (a_01->x).n[3];
  uStack_2f0 = (uVar16 >> 0x34) + (uVar6 & 0xffffffffffff);
  uVar11 = (uVar9 ^ 0x1000003d0) & uVar19 & uVar14 & uVar16 & (uStack_2f0 ^ 0xf000000000000);
  pcStack_308 = (code *)0x1516e8;
  secp256k1_fe_verify(&a_01->x);
  sStack_2c0.n[0] = (a_01->x).n[0];
  sStack_2c0.n[1] = (a_01->x).n[1];
  sStack_2c0.n[2] = (a_01->x).n[2];
  sStack_2c0.n[3] = (a_01->x).n[3];
  sStack_2c0.n[4] = (a_01->x).n[4];
  sStack_2c0.magnitude = (a_01->x).magnitude;
  sStack_2c0.normalized = (a_01->x).normalized;
  pcStack_308 = (code *)0x151711;
  secp256k1_fe_normalize_var(&sStack_2c0);
  sStack_2e8.v[0] = (sStack_2c0.n[1] << 0x34 | sStack_2c0.n[0]) & 0x3fffffffffffffff;
  uVar17 = (ulong)((uint)sStack_2c0.n[2] & 0xfffff) << 0x2a | sStack_2c0.n[1] >> 10;
  sStack_2e8.v[2] = (ulong)((uint)sStack_2c0.n[3] & 0x3fffffff) << 0x20 | sStack_2c0.n[2] >> 0x14;
  sStack_2e8.v[3] = (sStack_2c0.n[4] & 0xffffffffff) << 0x16 | sStack_2c0.n[3] >> 0x1e;
  sStack_2e8.v[4] = sStack_2c0.n[4] >> 0x28;
  pcStack_308 = (code *)0x1517a3;
  sStack_2e8.v[1] = uVar17;
  secp256k1_modinv64_var(&sStack_2e8,&secp256k1_const_modinfo_fe);
  pcStack_308 = (code *)0x1517ae;
  secp256k1_fe_from_signed62(&a_02->x,&sStack_2e8);
  (a_02->x).magnitude = (uint)(0 < (a_01->x).magnitude);
  (a_02->x).normalized = 1;
  pcStack_308 = (code *)0x1517ca;
  secp256k1_fe_verify(&a_02->x);
  uVar6 = (a_02->x).n[4];
  psVar15 = (secp256k1_gej *)(uVar6 & 0xffffffffffff);
  uVar12 = (uVar6 >> 0x30) * lStack_2f8 + (a_02->x).n[0];
  uVar6 = (uVar12 >> 0x34) + (a_02->x).n[1];
  uVar10 = (uVar6 >> 0x34) + (a_02->x).n[2];
  uVar13 = (uVar10 >> 0x34) + (a_02->x).n[3];
  ng = (secp256k1_scalar *)((long)(psVar15->x).n + (uVar13 >> 0x34));
  uVar18 = (uVar12 ^ 0x1000003d0) & uVar6 & uVar10 & uVar13 & ((ulong)ng ^ 0xf000000000000);
  bVar7 = uVar18 == 0xfffffffffffff ||
          ((uVar6 | uVar12 | uVar10 | uVar13) & 0xfffffffffffff) == 0 &&
          ng == (secp256k1_scalar *)0x0;
  uVar8 = CONCAT71(0xfffffffffff,bVar7);
  uVar6 = (uVar19 | uVar9 | uVar14 | uVar16) & 0xfffffffffffff | uStack_2f0;
  if ((uVar11 != 0xfffffffffffff && uVar6 != 0) != bVar7) {
    secp256k1_fe_verify(&a_02->x);
    return;
  }
  pcStack_308 = secp256k1_ecmult_multi_simple_var;
  secp256k1_fe_inv_var_cold_1();
  psStack_330 = a_02;
  uStack_328 = uVar18;
  uStack_320 = uVar6;
  psStack_318 = a_01;
  psStack_310 = &sStack_2e8;
  pcStack_308 = (code *)uVar11;
  secp256k1_gej_set_infinity(psVar15);
  secp256k1_gej_set_infinity(&sStack_d08);
  sStack_da0.x.n[0] = (uint64_t)asStack_c08;
  sStack_da0.x.n[1] = (uint64_t)asStack_a88;
  sStack_da0.x.n[2] = (uint64_t)&sStack_748;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_da0,psVar15,1,&sStack_d08,&secp256k1_scalar_zero,ng)
  ;
  if (uVar17 != 0) {
    uVar6 = 0;
    do {
      iVar5 = (*extraout_RDX)(&sStack_dc0,&sStack_c70,uVar6,uVar8);
      if (iVar5 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_da0,&sStack_c70);
      sStack_dd8.aux = asStack_c08;
      sStack_dd8.pre_a = asStack_a88;
      sStack_dd8.ps = &sStack_748;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_dd8,&sStack_d08,1,&sStack_da0,&sStack_dc0,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(psVar15,psVar15,&sStack_d08,(secp256k1_fe *)0x0);
      uVar6 = uVar6 + 1;
    } while (uVar17 != uVar6);
  }
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}